

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug_p.h
# Opt level: O3

void QtDebugUtils::formatQEnum<QEvent::Type>(QDebug *debug,Type value)

{
  char *pcVar1;
  long lVar2;
  storage_type *psVar3;
  Stream *pSVar4;
  long in_FS_OFFSET;
  QByteArrayView QVar5;
  undefined1 local_50 [16];
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QMetaObject::indexOfEnumerator((char *)&QEvent::staticMetaObject);
  local_50 = QMetaObject::enumerator(0x810fc0);
  lVar2 = QMetaEnum::valueToKey((ulonglong)local_50);
  pSVar4 = debug->stream;
  if (lVar2 == 0) {
    QTextStream::operator<<(&pSVar4->ts,value);
    pSVar4 = debug->stream;
    if (pSVar4->space != true) goto LAB_002c6c82;
  }
  else {
    psVar3 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar3 + lVar2 + 1;
      psVar3 = psVar3 + 1;
    } while (*pcVar1 != '\0');
    QVar5.m_data = psVar3;
    QVar5.m_size = (qsizetype)local_40;
    QString::fromUtf8(QVar5);
    QTextStream::operator<<(&pSVar4->ts,(QString *)local_40);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
    pSVar4 = debug->stream;
    if (pSVar4->space == false) goto LAB_002c6c82;
  }
  QTextStream::operator<<(&pSVar4->ts,' ');
LAB_002c6c82:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static inline void formatQEnum(QDebug &debug, QEnum value)
{
    const QMetaObject *metaObject = qt_getEnumMetaObject(value);
    const QMetaEnum me = metaObject->enumerator(metaObject->indexOfEnumerator(qt_getEnumName(value)));
    if (const char *key = me.valueToKey(int(value)))
        debug << key;
    else
        debug << int(value);
}